

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O3

Float __thiscall
pbrt::InvertCatmullRom(pbrt *this,span<const_float> nodes,span<const_float> f,Float u)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  ulong uVar12;
  float *pfVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM19 [64];
  undefined1 auVar31 [16];
  
  auVar27._4_60_ = in_register_00001204;
  auVar27._0_4_ = u;
  pfVar13 = (float *)nodes.n;
  if (u <= *pfVar13) {
    return *(Float *)this;
  }
  if (pfVar13[(long)f.ptr + -1] <= u) {
    return *(Float *)(this + (long)nodes.ptr * 4 + -4);
  }
  uVar12 = (long)f.ptr - 2;
  if ((long)uVar12 < 1) {
    uVar16 = 0;
  }
  else {
    lVar10 = 1;
    uVar16 = uVar12;
    do {
      uVar15 = uVar16 >> 1;
      uVar16 = ~uVar15 + uVar16;
      lVar9 = uVar15 + 1 + lVar10;
      if (u < pfVar13[(int)uVar15 + (int)lVar10]) {
        uVar16 = uVar15;
        lVar9 = lVar10;
      }
      lVar10 = lVar9;
    } while (0 < (long)uVar16);
    if (lVar10 - 1U < uVar12) {
      uVar12 = lVar10 - 1U;
    }
    uVar16 = 0;
    if (0 < lVar10) {
      uVar16 = uVar12;
    }
  }
  iVar14 = (int)uVar16;
  fVar1 = *(float *)(this + (long)iVar14 * 4);
  fVar2 = pfVar13[iVar14];
  lVar10 = (long)((uVar16 << 0x20) + 0x100000000) >> 0x1e;
  fVar33 = *(float *)((long)pfVar13 + lVar10);
  fVar3 = *(float *)(this + lVar10) - fVar1;
  if (iVar14 < 1) {
    fVar30 = fVar33 - fVar2;
  }
  else {
    fVar30 = (fVar3 * (fVar33 - pfVar13[iVar14 - 1])) /
             (*(float *)(this + lVar10) - *(float *)(this + (ulong)(iVar14 - 1) * 4));
  }
  auVar31 = ZEXT416((uint)fVar30);
  pfVar11 = (float *)((long)((uVar16 << 0x20) + 0x200000000) >> 0x20);
  if (pfVar11 < nodes.ptr) {
    auVar32._0_4_ =
         (fVar3 * (pfVar13[(long)pfVar11] - fVar2)) / (*(float *)(this + (long)pfVar11 * 4) - fVar1)
    ;
    auVar32._4_12_ = SUB6012((undefined1  [60])0x0,0);
  }
  else {
    auVar32 = ZEXT416((uint)(fVar33 - fVar2));
  }
  auVar20 = ZEXT816(0) << 0x40;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 + fVar33 * 0.0)),auVar31,auVar20);
  auVar18 = vfmadd231ss_fma(auVar18,auVar32,auVar20);
  fVar30 = auVar18._0_4_ - u;
  auVar18._8_4_ = 0x7fffffff;
  auVar18._0_8_ = 0x7fffffff7fffffff;
  auVar18._12_4_ = 0x7fffffff;
  auVar18 = vandps_avx512vl(ZEXT416((uint)fVar30),auVar18);
  if (1e-06 <= auVar18._0_4_) {
    auVar28 = ZEXT416((uint)fVar2);
    auVar29 = ZEXT416((uint)fVar33);
    auVar18 = vfmadd213ss_fma(ZEXT816(0) << 0x20,auVar28,auVar29);
    auVar18 = vfmadd231ss_fma(auVar18,auVar31,auVar20);
    auVar18 = vfmadd231ss_fma(auVar18,auVar32,auVar20);
    fVar2 = auVar18._0_4_ - u;
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar18 = vandps_avx512vl(ZEXT416((uint)fVar2),auVar20);
    fVar33 = auVar18._0_4_;
    if (1e-06 <= fVar33) {
      auVar34 = ZEXT816(0) << 0x20;
      auVar19 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      uVar4 = vcmpps_avx512vl(ZEXT416((uint)fVar30),auVar34,1);
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar35 = SUB6416(ZEXT464(0x3f800000),0);
      auVar20 = vsubss_avx512f(auVar34,ZEXT416((uint)(fVar30 / (fVar2 - fVar30))));
      auVar18 = auVar35;
      while( true ) {
        auVar21 = vaddss_avx512f(auVar18,auVar19);
        uVar5 = vcmpss_avx512f(auVar20,auVar18,1);
        bVar6 = (bool)((byte)uVar5 & 1);
        auVar25 = SUB6416(ZEXT464(0xc0000000),0);
        fVar2 = auVar21._0_4_ * 0.5;
        uVar5 = vcmpss_avx512f(auVar19,auVar20,1);
        bVar7 = (bool)((byte)uVar5 & 1);
        uVar17 = (uint)bVar7 * ((uint)bVar6 * auVar20._0_4_ + (uint)!bVar6 * (int)fVar2) +
                 (uint)!bVar7 * (int)fVar2;
        auVar20 = ZEXT416(uVar17);
        auVar21 = vmulss_avx512f(auVar20,auVar20);
        auVar22 = vmulss_avx512f(auVar20,auVar21);
        auVar36 = SUB6416(ZEXT464(0x40400000),0);
        auVar23 = vmulss_avx512f(auVar21,auVar36);
        auVar24 = vfmadd213ss_avx512f(auVar25,auVar22,auVar23);
        auVar23 = vfmsub231ss_avx512f(auVar23,auVar22,SUB6416(ZEXT464(0x40000000),0));
        auVar23 = vaddss_avx512f(auVar23,auVar35);
        auVar24 = vmulss_avx512f(auVar29,auVar24);
        auVar23 = vfmadd231ss_avx512f(auVar24,auVar28,auVar23);
        auVar24 = vfmadd213ss_avx512f(auVar25,auVar21,auVar22);
        auVar22 = vsubss_avx512f(auVar22,auVar21);
        auVar24 = vaddss_avx512f(auVar20,auVar24);
        auVar23 = vfmadd213ss_avx512f(auVar24,auVar31,auVar23);
        auVar22 = vfmadd213ss_avx512f(auVar22,auVar32,auVar23);
        auVar22 = vsubss_avx512f(auVar22,auVar27._0_16_);
        auVar23 = vandps_avx512vl(auVar22,auVar37);
        vucomiss_avx512f(auVar23);
        if (fVar33 < 1e-06) break;
        uVar5 = vcmpps_avx512vl(auVar22,auVar34,5);
        bVar8 = (byte)uVar4 ^ (byte)uVar5;
        auVar18 = ZEXT416((uint)(bVar8 & 1) * auVar18._0_4_ + !(bool)(bVar8 & 1) * uVar17);
        auVar19._0_4_ = (bVar8 & 1) * uVar17 + (uint)!(bool)(bVar8 & 1) * auVar19._0_4_;
        auVar23 = vsubss_avx512f(auVar18,auVar19);
        vucomiss_avx512f(auVar23);
        if (fVar33 < 1e-06) break;
        auVar23 = vmulss_avx512f(auVar20,ZEXT416(0x40c00000));
        auVar24 = vmulss_avx512f(auVar20,auVar25);
        auVar25 = vmulss_avx512f(auVar20,ZEXT416(0xc0800000));
        auVar26 = vfmsub213ss_avx512f(ZEXT416(0x40c00000),auVar21,auVar23);
        auVar23 = vfmadd231ss_avx512f(auVar23,auVar21,ZEXT416(0xc0c00000));
        auVar25 = vfmadd231ss_avx512f(auVar25,auVar21,auVar36);
        auVar21 = vfmadd231ss_avx512f(auVar24,auVar21,auVar36);
        auVar23 = vmulss_avx512f(auVar29,auVar23);
        auVar24 = vaddss_avx512f(auVar25,auVar35);
        auVar23 = vfmadd231ss_avx512f(auVar23,auVar28,auVar26);
        auVar23 = vfmadd231ss_avx512f(auVar23,auVar31,auVar24);
        auVar21 = vfmadd231ss_avx512f(auVar23,auVar32,auVar21);
        auVar21 = vdivss_avx512f(auVar22,auVar21);
        auVar20 = vsubss_avx512f(auVar20,auVar21);
      }
    }
    else {
      auVar20 = SUB6416(ZEXT464(0x3f800000),0);
    }
  }
  auVar31 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar20,ZEXT416((uint)fVar1));
  return auVar31._0_4_;
}

Assistant:

Float InvertCatmullRom(pstd::span<const Float> nodes, pstd::span<const Float> f,
                       Float u) {
    // Stop when _u_ is out of bounds
    if (!(u > f.front()))
        return nodes.front();
    else if (!(u < f.back()))
        return nodes.back();

    // Map _u_ to a spline interval by inverting _f_
    int i = FindInterval(f.size(), [&](int i) { return f[i] <= u; });

    // Look up $x_i$ and function values of spline segment _i_
    Float x0 = nodes[i], x1 = nodes[i + 1];
    Float f0 = f[i], f1 = f[i + 1];
    Float width = x1 - x0;

    // Approximate derivatives using finite differences
    Float d0 = (i > 0) ? width * (f1 - f[i - 1]) / (x1 - nodes[i - 1]) : (f1 - f0);
    Float d1 = (i + 2 < nodes.size()) ? width * (f[i + 2] - f0) / (nodes[i + 2] - x0)
                                      : (f1 - f0);

    // Invert the spline interpolant using Newton-Bisection
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        // Compute powers of _t_
        Float t2 = t * t, t3 = t2 * t;

        // Set _Fhat_ using Equation (\ref{eq:cubicspline-as-basisfunctions})
        Float Fhat = (2 * t3 - 3 * t2 + 1) * f0 + (-2 * t3 + 3 * t2) * f1 +
                     (t3 - 2 * t2 + t) * d0 + (t3 - t2) * d1;

        // Set _fhat_ using Equation (\ref{eq:cubicspline-derivative})
        Float fhat = (6 * t2 - 6 * t) * f0 + (-6 * t2 + 6 * t) * f1 +
                     (3 * t2 - 4 * t + 1) * d0 + (3 * t2 - 2 * t) * d1;

        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);
    return x0 + t * width;
}